

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.h
# Opt level: O2

Ptr __thiscall core::image::integral_image<unsigned_char,long>(image *this,ConstPtr *image)

{
  int width;
  uint chans;
  element_type *peVar1;
  invalid_argument *this_00;
  pointer plVar2;
  pointer plVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int cc;
  pointer plVar4;
  pointer plVar5;
  long lVar6;
  int i;
  long lVar7;
  size_type __n;
  int height;
  pointer plVar8;
  Ptr PVar9;
  undefined1 local_58 [8];
  vector<long,_std::allocator<long>_> zeros;
  allocator_type local_31;
  
  peVar1 = (image->super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Null image given");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  width = (peVar1->super_TypedImageBase<unsigned_char>).super_ImageBase.w;
  height = (peVar1->super_TypedImageBase<unsigned_char>).super_ImageBase.h;
  chans = (peVar1->super_TypedImageBase<unsigned_char>).super_ImageBase.c;
  Image<long>::create();
  TypedImageBase<long>::allocate(*(TypedImageBase<long> **)this,width,height,chans);
  __n = (size_type)(int)(width * chans);
  zeros.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)local_58,__n,
             (value_type_conflict8 *)
             &zeros.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,&local_31);
  peVar1 = (image->super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
  plVar2 = (pointer)(peVar1->super_TypedImageBase<unsigned_char>).data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
  plVar3 = (pointer)0x0;
  if (plVar2 == *(pointer *)
                 ((long)&(peVar1->super_TypedImageBase<unsigned_char>).data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data + 8)) {
    plVar2 = plVar3;
  }
  plVar4 = *(pointer *)(*(long *)this + 0x18);
  if (plVar4 == *(pointer *)(*(long *)this + 0x20)) {
    plVar4 = plVar3;
  }
  plVar8 = (pointer)(ulong)chans;
  if ((int)chans < 1) {
    plVar8 = plVar3;
  }
  if (height < 1) {
    height = 0;
  }
  for (; (int)plVar3 != height; plVar3 = (pointer)(ulong)((int)plVar3 + 1)) {
    for (plVar5 = (pointer)0x0; plVar8 != plVar5; plVar5 = (pointer)((long)plVar5 + 1)) {
      plVar4[(long)plVar5] =
           (ulong)*(byte *)((long)plVar2 + (long)plVar5) + *(long *)((long)local_58 + plVar5 * 8);
    }
    lVar6 = 0;
    for (lVar7 = (long)(int)chans; lVar7 < (long)__n; lVar7 = lVar7 + 1) {
      plVar4[lVar7] =
           ((ulong)*(byte *)((long)plVar2 + lVar7) + *(long *)((long)local_58 + lVar7 * 8) +
           *(long *)((long)plVar4 + lVar6)) - *(long *)((long)local_58 + lVar6);
      lVar6 = lVar6 + 8;
    }
    plVar2 = (pointer)((long)plVar2 + __n);
    local_58 = (undefined1  [8])plVar4;
    plVar4 = plVar4 + __n;
  }
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)local_58);
  PVar9.super___shared_ptr<core::Image<long>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar9.super___shared_ptr<core::Image<long>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar9.super___shared_ptr<core::Image<long>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

typename Image<T_OUT>::Ptr
integral_image (typename Image<T_IN>::ConstPtr image)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    int const width = image->width();
    int const height = image->height();
    int const chans = image->channels();
    int const row_stride = width * chans;

    typename Image<T_OUT>::Ptr ret(Image<T_OUT>::create());
    ret->allocate(width, height, chans);

    /* Input image row and destination image rows. */
    std::vector<T_OUT> zeros(row_stride, T_OUT(0));
    T_IN const* inrow = image->get_data_pointer();
    T_OUT* dest = ret->get_data_pointer();
    T_OUT* prev = &zeros[0];

    /*
     * I(x,y) = i(x,y) + I(x-1,y) + I(x,y-1) - I(x-1,y-1)
     */
    for (int y = 0; y < height; ++y)
    {
        /* Calculate first pixel in row. */
        for (int cc = 0; cc < chans; ++cc)
            dest[cc] = static_cast<T_OUT>(inrow[cc]) + prev[cc];
        /* Calculate all following pixels in row. */
        for (int i = chans; i < row_stride; ++i)
            dest[i] = inrow[i] + prev[i] + dest[i - chans] - prev[i - chans];

        prev = dest;
        dest += row_stride;
        inrow += row_stride;
    }

    return ret;
}